

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

double calculate_sd<sparse_parameters>(vw *param_1,sparse_parameters *weights)

{
  _Hash_node_base **pp_Var1;
  int iVar2;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> __tmp_1;
  _Hash_node_base *p_Var3;
  pointer pdVar4;
  _Node_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false> __tmp;
  _Hash_node_base *p_Var5;
  double dVar6;
  vector<double,_std::allocator<double>_> diff;
  allocator_type local_31;
  double local_30;
  vector<double,_std::allocator<double>_> local_28;
  
  p_Var3 = (weights->_map)._M_h._M_before_begin._M_nxt;
  local_30 = 0.0;
  p_Var5 = p_Var3;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      calculate_sd<sparse_parameters>::my_size = calculate_sd<sparse_parameters>::my_size + 1;
      pp_Var1 = &p_Var5->_M_nxt;
      p_Var5 = *pp_Var1;
    } while (*pp_Var1 != (_Hash_node_base *)0x0);
    if (p_Var3 != (_Hash_node_base *)0x0) {
      local_30 = 0.0;
      do {
        p_Var5 = p_Var3 + 2;
        p_Var3 = p_Var3->_M_nxt;
        local_30 = local_30 + (double)*(float *)&p_Var5->_M_nxt->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
  }
  iVar2 = calculate_sd<sparse_parameters>::my_size;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,(long)calculate_sd<sparse_parameters>::my_size,&local_31);
  p_Var3 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    pdVar4 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      *pdVar4 = (double)*(float *)&(p_Var3[2]._M_nxt)->_M_nxt - local_30 / (double)iVar2;
      p_Var3 = p_Var3->_M_nxt;
      pdVar4 = pdVar4 + 1;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  dVar6 = 0.0;
  for (pdVar4 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    dVar6 = dVar6 + *pdVar4 * *pdVar4;
  }
  dVar6 = dVar6 / (double)calculate_sd<sparse_parameters>::my_size;
  if (dVar6 < 0.0) {
    local_30 = sqrt(dVar6);
  }
  else {
    local_30 = SQRT(dVar6);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_30;
}

Assistant:

double calculate_sd(vw& /* all */, T& weights)
{
  static int my_size = 0;
  for_each(weights.begin(), weights.end(), [](float /* v */) { my_size += 1; });
  double sum = accumulate(weights.begin(), weights.end(), 0.0);
  double mean = sum / my_size;
  vector<double> diff(my_size);
  transform(weights.begin(), weights.end(), diff.begin(), [mean](double x) { return x - mean; });
  double sq_sum = inner_product(diff.begin(), diff.end(), diff.begin(), 0.0);
  return sqrt(sq_sum / my_size);
}